

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O0

database_binder *
sqlite::operator<<(database_binder *db,
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *val)

{
  int inx;
  pointer stmt;
  char *in_RCX;
  str_ref sql;
  string local_50;
  undefined1 local_30 [16];
  int local_1c;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poStack_18;
  int result;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *val_local;
  database_binder *db_local;
  
  poStack_18 = val;
  val_local = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)db;
  stmt = std::unique_ptr<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>::get(&db->_stmt);
  inx = database_binder::_next_index((database_binder *)val_local);
  local_1c = bind_col_in_db<std::__cxx11::string>(stmt,inx,poStack_18);
  if (local_1c != 0) {
    database_binder::sql_abi_cxx11_(&local_50,(database_binder *)val_local);
    local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    sql._M_len = local_30._8_8_;
    sql._M_str = in_RCX;
    errors::throw_sqlite_error((errors *)&local_1c,local_30._0_8_,sql);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (database_binder *)val_local;
}

Assistant:

database_binder &operator<<(database_binder& db, T&& val) {
		int result = bind_col_in_db(db._stmt.get(), db._next_index(), std::forward<T>(val));
		if(result != SQLITE_OK)
			exceptions::throw_sqlite_error(result, db.sql());
		return db;
	}